

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configManager.cpp
# Opt level: O3

void ConfigManager::storeFilter(ofstream *out,FilterSlicer *filter)

{
  pointer pPVar1;
  ulong uVar2;
  long lVar3;
  uint32_t n;
  double y;
  double x;
  uint local_44;
  undefined8 local_40;
  undefined8 local_38;
  
  local_44 = (uint)((ulong)((long)(filter->poly).
                                  super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(filter->poly).
                                 super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::ostream::write((char *)out,(long)&local_44);
  if (local_44 != 0) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      pPVar1 = (filter->poly).super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_38 = *(undefined8 *)((long)pPVar1 + lVar3 + -8);
      local_40 = *(undefined8 *)((long)&pPVar1->x + lVar3);
      std::ostream::write((char *)out,(long)&local_38);
      std::ostream::write((char *)out,(long)&local_40);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < local_44);
  }
  return;
}

Assistant:

void ConfigManager::storeFilter(std::ofstream &out, FilterSlicer* filter) {
	uint32_t n = filter->poly.size();
	out.write((char*)&n, sizeof(n));
	for(int i=0;i<n;++i)
	{
		double x,y;
		x = filter->poly[i].x;
		y = filter->poly[i].y;
		out.write((char*)&x, sizeof(x));
		out.write((char*)&y, sizeof(y));
	}
}